

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O0

Continue __thiscall
anon_unknown.dwarf_140f6::Result::Func2(Result *this,string_view key,string_view arg)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_88;
  char *local_78;
  char *local_70;
  allocator<char> local_51;
  key_type local_50;
  Result *local_30;
  Result *this_local;
  string_view arg_local;
  string_view key_local;
  
  arg_local._M_str = (char *)key._M_len;
  arg_local._M_len = (size_t)arg._M_str;
  this_local = (Result *)arg._M_len;
  local_30 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,
             (basic_string_view<char,_std::char_traits<char>_> *)&arg_local._M_str,&local_51);
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::operator[](&this->Func2_,&local_50);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            (this_00,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_78 = arg_local._M_str;
  local_70 = key._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"FUNC_2b");
  __x._M_str = local_70;
  __x._M_len = (size_t)local_78;
  bVar1 = std::operator==(__x,local_88);
  return (uint)bVar1;
}

Assistant:

ArgumentParser::Continue Func2(cm::string_view key, cm::string_view arg)
  {
    Func2_[std::string(key)].emplace_back(arg);
    return key == "FUNC_2b" ? ArgumentParser::Continue::Yes
                            : ArgumentParser::Continue::No;
  }